

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O2

void __thiscall
spvtools::opt::FixStorageClass::ChangeResultStorageClass
          (FixStorageClass *this,Instruction *inst,StorageClass storage_class)

{
  uint32_t uVar1;
  TypeManager *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  this_01 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar1 = Instruction::type_id(inst);
  this_02 = analysis::DefUseManager::GetDef(this_01,uVar1);
  if (this_02->opcode_ == OpTypePointer) {
    uVar1 = Instruction::GetSingleWordInOperand(this_02,1);
    uVar1 = analysis::TypeManager::FindPointerToType(this_00,uVar1,storage_class);
    Instruction::SetResultType(inst,uVar1);
    IRContext::UpdateDefUse((this->super_Pass).context_,inst);
    return;
  }
  __assert_fail("result_type_inst->opcode() == spv::Op::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                ,0x87,
                "void spvtools::opt::FixStorageClass::ChangeResultStorageClass(Instruction *, spv::StorageClass) const"
               );
}

Assistant:

void FixStorageClass::ChangeResultStorageClass(
    Instruction* inst, spv::StorageClass storage_class) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  Instruction* result_type_inst = get_def_use_mgr()->GetDef(inst->type_id());
  assert(result_type_inst->opcode() == spv::Op::OpTypePointer);
  uint32_t pointee_type_id = result_type_inst->GetSingleWordInOperand(1);
  uint32_t new_result_type_id =
      type_mgr->FindPointerToType(pointee_type_id, storage_class);
  inst->SetResultType(new_result_type_id);
  context()->UpdateDefUse(inst);
}